

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int * Vec_IntUniqueLookup(Vec_Int_t *vData,int i,int nIntSize,int *pNexts,int *pStart)

{
  int iVar1;
  int *__s1;
  int *__s2;
  int *pData;
  int *pStart_local;
  int *pNexts_local;
  int nIntSize_local;
  int i_local;
  Vec_Int_t *vData_local;
  
  __s1 = Vec_IntEntryP(vData,i * nIntSize);
  pData = pStart;
  while( true ) {
    if (*pData == -1) {
      return pData;
    }
    __s2 = Vec_IntEntryP(vData,*pData * nIntSize);
    iVar1 = memcmp(__s1,__s2,(long)nIntSize << 2);
    if (iVar1 == 0) break;
    pData = pNexts + *pData;
  }
  return pData;
}

Assistant:

static inline int * Vec_IntUniqueLookup( Vec_Int_t * vData, int i, int nIntSize, int * pNexts, int * pStart )
{
    int * pData = Vec_IntEntryP( vData, i*nIntSize );
    for ( ; *pStart != -1; pStart = pNexts + *pStart )
        if ( !memcmp( pData, Vec_IntEntryP(vData, *pStart*nIntSize), sizeof(int) * nIntSize ) )
            return pStart;
    return pStart;
}